

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::printMedicines(Shop *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  string *psVar7;
  undefined1 local_a8 [8];
  Medicine medicine;
  int i;
  Shop *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"ID");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Name");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = std::operator<<(poVar3,"Company Name");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Unit Price");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"In Stock");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Quantity");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Arrival Date");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Expire Date");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  medicine._140_4_ = 0;
  while( true ) {
    uVar4 = (ulong)(int)medicine._140_4_;
    sVar5 = std::vector<Medicine,_std::allocator<Medicine>_>::size(&this->medicineList);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                       (&this->medicineList,(long)(int)medicine._140_4_);
    Medicine::Medicine((Medicine *)local_a8,pvVar6);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,medicine._140_4_ + 1);
    poVar3 = std::operator<<(poVar3,"\t");
    psVar7 = Medicine::getName_abi_cxx11_((Medicine *)local_a8);
    poVar3 = std::operator<<(poVar3,(string *)psVar7);
    poVar3 = std::operator<<(poVar3,"\t");
    psVar7 = Medicine::getCompanyName_abi_cxx11_((Medicine *)local_a8);
    poVar3 = std::operator<<(poVar3,(string *)psVar7);
    poVar3 = std::operator<<(poVar3,"\t    ");
    iVar2 = Medicine::getUnitePrice((Medicine *)local_a8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\t\t   ");
    bVar1 = Medicine::getIsStock((Medicine *)local_a8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
    poVar3 = std::operator<<(poVar3,"\t\t  ");
    iVar2 = Medicine::getQuantity((Medicine *)local_a8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"\t\t  ");
    psVar7 = Medicine::getArrivalDate_abi_cxx11_((Medicine *)local_a8);
    poVar3 = std::operator<<(poVar3,(string *)psVar7);
    poVar3 = std::operator<<(poVar3,"\t");
    psVar7 = Medicine::getExpireDate_abi_cxx11_((Medicine *)local_a8);
    poVar3 = std::operator<<(poVar3,(string *)psVar7);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Medicine::~Medicine((Medicine *)local_a8);
    medicine._140_4_ = medicine._140_4_ + 1;
  }
  return;
}

Assistant:

void printMedicines() {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        for (int i = 0; i < medicineList.size(); i++) {
            Medicine medicine = medicineList[i];
            cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
                 << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
                 << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
        }
    }